

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O2

pair<wasm::Expression_*,_wasm::Expression_*> __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
          (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this)

{
  _Elt_pointer ppVar1;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar2;
  bool bVar3;
  mapped_type *pmVar4;
  undefined1 auStack_38 [8];
  pair<wasm::Expression_*,_wasm::Expression_*> item;
  
  do {
    bVar3 = empty(this);
    if (bVar3) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::Expression *, wasm::Expression *>>::pop() [T = std::pair<wasm::Expression *, wasm::Expression *>]"
                   );
    }
    ppVar1 = (this->data).c.
             super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    auStack_38 = (undefined1  [8])ppVar1->first;
    item.first = ppVar1->second;
    pmVar4 = std::__detail::
             _Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
    *pmVar4 = *pmVar4 - 1;
    std::
    deque<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
    ::pop_front((deque<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                 *)this);
    pmVar4 = std::__detail::
             _Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
  } while (*pmVar4 != 0);
  pVar2.second = item.first;
  pVar2.first = (Expression *)auStack_38;
  return pVar2;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }